

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O1

void __thiscall
trackerboy::apu::Hardware::
runAndMixChannel<trackerboy::apu::WaveChannel,(trackerboy::apu::MixMode)2>
          (Hardware *this,size_t index,WaveChannel *ch,Mixer *mixer,uint32_t cycletime,
          uint32_t cycles)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  char cVar6;
  uint32_t uVar7;
  byte bVar8;
  uint32_t cycletime_00;
  int iVar9;
  uint8_t out;
  
  uVar1 = (ch->super_Channel).mOutput;
  cVar6 = uVar1 - (this->mLastOutputs)._M_elems[index];
  if (cVar6 != '\0') {
    Mixer::mixfast<(trackerboy::apu::MixMode)2>(mixer,cVar6,cycletime);
    (this->mLastOutputs)._M_elems[index] = uVar1;
  }
  uVar3 = (ch->super_Channel).mTimer.mCounter;
  uVar7 = uVar3 - cycles;
  if (uVar3 < cycles || uVar7 == 0) {
    uVar4 = (ch->super_Channel).mTimer.mPeriod;
    iVar9 = (cycles - uVar3) / uVar4 + 1;
    uVar7 = uVar4 - (cycles - uVar3) % uVar4;
  }
  else {
    iVar9 = 0;
  }
  (ch->super_Channel).mTimer.mCounter = uVar7;
  if (iVar9 != 0) {
    cycletime_00 = uVar3 + cycletime;
    uVar7 = (ch->super_Channel).mTimer.mPeriod;
    do {
      bVar2 = ch->mWaveIndex;
      bVar8 = bVar2 + 1 & 0x1f;
      ch->mWaveIndex = bVar8;
      bVar8 = (ch->mWaveram)._M_elems[bVar8 >> 1];
      bVar5 = bVar8 >> 4;
      if ((bVar2 & 1) == 0) {
        bVar5 = bVar8 & 0xf;
      }
      ch->mSampleBuffer = bVar5;
      bVar5 = bVar5 >> (ch->mVolumeShift & 0x1f);
      (ch->super_Channel).mOutput = bVar5;
      cVar6 = bVar5 - (this->mLastOutputs)._M_elems[index];
      if (cVar6 != '\0') {
        Mixer::mixfast<(trackerboy::apu::MixMode)2>(mixer,cVar6,cycletime_00);
        (this->mLastOutputs)._M_elems[index] = bVar5;
      }
      cycletime_00 = cycletime_00 + uVar7;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  return;
}

Assistant:

void Hardware::runAndMixChannel(size_t index, Channel &ch, Mixer &mixer, uint32_t cycletime, uint32_t cycles) noexcept {
    static_assert(mode != MixMode::mute, "cannot mix a muted mode");

    auto &last = mLastOutputs[index];

    auto mixChanges = [&]() {
        // mix any change in output
        if (auto out = ch.output(); out != last) {
            mixer.mixfast<mode>(out - last, cycletime);
            last = out;
        }
    };


    auto &timer = ch.timer();

    mixChanges();
    cycletime += timer.counter();

    // determine the number of clocks we are stepping
    auto clocks = timer.fastforward(cycles);
    auto const period = timer.period();

    // iterate each clock and mix any change in output
    while (clocks) {
        ch.clock();
        --clocks;
        mixChanges();
        cycletime += period;
    }

}